

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_tick(xm_context_t *ctx)

{
  char cVar1;
  xm_channel_context_t *ch_00;
  long in_RDI;
  float fVar2;
  float fVar3;
  float volume;
  float panning;
  float v;
  float f_1;
  float f;
  char arp_offset;
  xm_channel_context_t *ch;
  uint8_t i;
  xm_channel_context_t *in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  xm_context_t *in_stack_ffffffffffffffc0;
  float local_30;
  float local_28;
  float in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined7 in_stack_fffffffffffffff0;
  byte bVar4;
  
  local_30 = in_stack_ffffffffffffffb4;
  if (*(short *)(in_RDI + 0x13e) == 0) {
    xm_row((xm_context_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    local_30 = in_stack_ffffffffffffffb4;
  }
  bVar4 = 0;
  do {
    if (*(ushort *)(in_RDI + 0xc) <= (ushort)bVar4) {
      *(short *)(in_RDI + 0x13e) = *(short *)(in_RDI + 0x13e) + 1;
      if ((uint)*(ushort *)(in_RDI + 300) + (uint)*(ushort *)(in_RDI + 0x154) <=
          (uint)*(ushort *)(in_RDI + 0x13e)) {
        *(undefined2 *)(in_RDI + 0x13e) = 0;
        *(undefined2 *)(in_RDI + 0x154) = 0;
      }
      *(float *)(in_RDI + 0x140) =
           (float)*(uint *)(in_RDI + 0x128) / ((float)*(ushort *)(in_RDI + 0x12e) * 0.4) +
           *(float *)(in_RDI + 0x140);
      return;
    }
    ch_00 = (xm_channel_context_t *)(*(long *)(in_RDI + 0x168) + (long)(int)(uint)bVar4 * 0x138);
    xm_envelopes((xm_channel_context_t *)0x1079dc);
    xm_autovibrato(in_stack_ffffffffffffffc0,
                   (xm_channel_context_t *)
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (((ch_00->arp_in_progress & 1U) != 0) &&
       ((ch_00->current->effect_type != '\0' || (ch_00->current->effect_param == '\0')))) {
      ch_00->arp_in_progress = false;
      ch_00->arp_note_offset = '\0';
      xm_update_frequency((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
    }
    if (((((ch_00->vibrato_in_progress & 1U) != 0) && (ch_00->current->effect_type != '\x04')) &&
        (ch_00->current->effect_type != '\x06')) &&
       ((int)(uint)ch_00->current->volume_column >> 4 != 0xb)) {
      ch_00->vibrato_in_progress = false;
      ch_00->vibrato_note_offset = 0.0;
      xm_update_frequency((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
    }
    switch(ch_00->current->volume_column >> 4) {
    case '\x06':
      if (*(short *)(in_RDI + 0x13e) != 0) {
        xm_volume_slide(ch_00,ch_00->current->volume_column & 0xf);
      }
      break;
    case '\a':
      if (*(short *)(in_RDI + 0x13e) != 0) {
        xm_volume_slide(ch_00,ch_00->current->volume_column << 4);
      }
      break;
    default:
      break;
    case '\v':
      if (*(short *)(in_RDI + 0x13e) != 0) {
        ch_00->vibrato_in_progress = false;
        xm_vibrato((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,'\0');
      }
      break;
    case '\r':
      if (*(short *)(in_RDI + 0x13e) != 0) {
        xm_panning_slide(ch_00,ch_00->current->volume_column & 0xf);
      }
      break;
    case '\x0e':
      if (*(short *)(in_RDI + 0x13e) != 0) {
        xm_panning_slide(ch_00,ch_00->current->volume_column << 4);
      }
      break;
    case '\x0f':
      if (*(short *)(in_RDI + 0x13e) != 0) {
        xm_tone_portamento(in_stack_ffffffffffffffc0,
                           (xm_channel_context_t *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
    }
    in_stack_ffffffffffffffc0 = (xm_context_t *)(ulong)ch_00->current->effect_type;
    switch(in_stack_ffffffffffffffc0) {
    case (xm_context_t *)0x0:
      if (ch_00->current->effect_param != '\0') {
        cVar1 = (char)*(ushort *)(in_RDI + 300) + (char)(*(ushort *)(in_RDI + 300) / 3) * -3;
        in_stack_ffffffffffffffe4 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffe4);
        in_stack_ffffffffffffffbc = (int)cVar1;
        if (cVar1 == '\0') {
LAB_00107d2b:
          xm_arpeggio((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8,'\0',0);
        }
        else if (in_stack_ffffffffffffffbc == 1) {
LAB_00107cf5:
          if (*(short *)(in_RDI + 0x13e) != 0) goto LAB_00107d2b;
          ch_00->arp_in_progress = false;
          ch_00->arp_note_offset = '\0';
          xm_update_frequency((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffa8);
        }
        else if (in_stack_ffffffffffffffbc == 2) {
          if (*(short *)(in_RDI + 0x13e) != 1) goto LAB_00107cf5;
          ch_00->arp_in_progress = true;
          ch_00->arp_note_offset = (uint8_t)((int)(uint)ch_00->current->effect_param >> 4);
          xm_update_frequency((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffa8);
        }
      }
      break;
    case (xm_context_t *)0x1:
      if (*(short *)(in_RDI + 0x13e) != 0) {
        xm_pitch_slide((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,0.0);
      }
      break;
    case (xm_context_t *)0x2:
      if (*(short *)(in_RDI + 0x13e) != 0) {
        xm_pitch_slide((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,0.0);
      }
      break;
    case (xm_context_t *)0x3:
      if (*(short *)(in_RDI + 0x13e) != 0) {
        xm_tone_portamento(in_stack_ffffffffffffffc0,
                           (xm_channel_context_t *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      }
      break;
    case (xm_context_t *)0x4:
      if (*(short *)(in_RDI + 0x13e) != 0) {
        ch_00->vibrato_in_progress = true;
        xm_vibrato((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,'\0');
      }
      break;
    case (xm_context_t *)0x5:
      if (*(short *)(in_RDI + 0x13e) != 0) {
        xm_tone_portamento(in_stack_ffffffffffffffc0,
                           (xm_channel_context_t *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        xm_volume_slide(ch_00,ch_00->volume_slide_param);
      }
      break;
    case (xm_context_t *)0x6:
      if (*(short *)(in_RDI + 0x13e) != 0) {
        ch_00->vibrato_in_progress = true;
        xm_vibrato((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,'\0');
        xm_volume_slide(ch_00,ch_00->volume_slide_param);
      }
      break;
    case (xm_context_t *)0x7:
      if (*(short *)(in_RDI + 0x13e) != 0) {
        ch_00->tremolo_ticks = ch_00->tremolo_ticks + '\x01';
        xm_tremolo((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,'\0',0);
      }
      break;
    default:
      break;
    case (xm_context_t *)0xa:
      if (*(short *)(in_RDI + 0x13e) != 0) {
        xm_volume_slide(ch_00,ch_00->volume_slide_param);
      }
      break;
    case (xm_context_t *)0xe:
      in_stack_ffffffffffffffb8 = (uint)(ch_00->current->effect_param >> 4);
      if (in_stack_ffffffffffffffb8 == 9) {
        if (((*(short *)(in_RDI + 0x13e) != 0) && ((ch_00->current->effect_param & 0xf) != 0)) &&
           ((int)((ulong)*(ushort *)(in_RDI + 0x13e) %
                 (ulong)(long)(int)(ch_00->current->effect_param & 0xf)) == 0)) {
          xm_trigger_note((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8,0);
          xm_envelopes((xm_channel_context_t *)0x107ff0);
        }
      }
      else if (in_stack_ffffffffffffffb8 == 0xc) {
        if ((ch_00->current->effect_param & 0xf) == *(ushort *)(in_RDI + 0x13e)) {
          xm_cut_note(ch_00);
        }
      }
      else if ((in_stack_ffffffffffffffb8 == 0xd) &&
              ((ushort)ch_00->note_delay_param == *(ushort *)(in_RDI + 0x13e))) {
        xm_handle_note_and_instrument
                  ((xm_context_t *)CONCAT17(bVar4,in_stack_fffffffffffffff0),ch_00,
                   (xm_pattern_slot_t *)
                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        xm_envelopes((xm_channel_context_t *)0x10805b);
      }
      break;
    case (xm_context_t *)0x11:
      if ((*(short *)(in_RDI + 0x13e) != 0) &&
         (((ch_00->global_volume_slide_param & 0xf0) == 0 ||
          ((ch_00->global_volume_slide_param & 0xf) == 0)))) {
        if ((ch_00->global_volume_slide_param & 0xf0) == 0) {
          *(float *)(in_RDI + 0x130) =
               *(float *)(in_RDI + 0x130) - (float)(ch_00->global_volume_slide_param & 0xf) / 64.0;
          if (*(float *)(in_RDI + 0x130) <= 0.0 && *(float *)(in_RDI + 0x130) != 0.0) {
            *(undefined4 *)(in_RDI + 0x130) = 0;
          }
        }
        else {
          in_stack_ffffffffffffffe0 =
               (float)((int)(uint)ch_00->global_volume_slide_param >> 4) / 64.0;
          *(float *)(in_RDI + 0x130) = in_stack_ffffffffffffffe0 + *(float *)(in_RDI + 0x130);
          if (1.0 < *(float *)(in_RDI + 0x130)) {
            *(undefined4 *)(in_RDI + 0x130) = 0x3f800000;
          }
        }
      }
      break;
    case (xm_context_t *)0x14:
      if (*(ushort *)(in_RDI + 0x13e) == (ushort)ch_00->current->effect_param) {
        xm_key_off((xm_channel_context_t *)0x1081b8);
      }
      break;
    case (xm_context_t *)0x19:
      if (*(short *)(in_RDI + 0x13e) != 0) {
        xm_panning_slide(ch_00,ch_00->panning_slide_param);
      }
      break;
    case (xm_context_t *)0x1b:
      if (((*(short *)(in_RDI + 0x13e) != 0) && ((ch_00->multi_retrig_param & 0xf) != 0)) &&
         (((int)((ulong)*(ushort *)(in_RDI + 0x13e) %
                (ulong)(long)(int)(ch_00->multi_retrig_param & 0xf)) == 0 &&
          ((xm_trigger_note((xm_context_t *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8,0), ch_00->current->volume_column == '\0' &&
           (((ch_00->instrument->volume_envelope).enabled & 1U) == 0)))))) {
        local_28 = ch_00->volume * multi_retrig_multiply[(int)(uint)ch_00->multi_retrig_param >> 4]
                   + multi_retrig_add[(int)(uint)ch_00->multi_retrig_param >> 4] / 64.0;
        if (local_28 <= 1.0) {
          if (local_28 < 0.0) {
            local_28 = 0.0;
          }
        }
        else {
          local_28 = 1.0;
        }
        ch_00->volume = local_28;
      }
      break;
    case (xm_context_t *)0x1d:
      if (*(short *)(in_RDI + 0x13e) != 0) {
        ch_00->tremor_on =
             (int)(uint)ch_00->tremor_param >> 4 <
             (int)(*(ushort *)(in_RDI + 0x13e) - 1) %
             (int)(((int)(uint)ch_00->tremor_param >> 4) + (ch_00->tremor_param & 0xf) + 2);
      }
    }
    fVar2 = (ch_00->panning_envelope_panning - 0.5) * (0.5 - ABS(ch_00->panning - 0.5));
    fVar2 = fVar2 + fVar2 + ch_00->panning;
    if ((ch_00->tremor_on & 1U) == 0) {
      local_30 = ch_00->volume + ch_00->tremolo_volume;
      if (local_30 <= 1.0) {
        if (local_30 < 0.0) {
          local_30 = 0.0;
        }
      }
      else {
        local_30 = 1.0;
      }
      local_30 = ch_00->fadeout_volume * ch_00->volume_envelope_volume * local_30;
    }
    else {
      local_30 = 0.0;
    }
    in_stack_ffffffffffffffb0 = local_30;
    fVar3 = sqrtf(1.0 - fVar2);
    ch_00->target_volume[0] = in_stack_ffffffffffffffb0 * fVar3;
    fVar2 = sqrtf(fVar2);
    ch_00->target_volume[1] = local_30 * fVar2;
    bVar4 = bVar4 + 1;
  } while( true );
}

Assistant:

static void xm_tick(xm_context_t* ctx) {
	if(ctx->current_tick == 0) {
		xm_row(ctx);
	}

	for(uint8_t i = 0; i < ctx->module.num_channels; ++i) {
		xm_channel_context_t* ch = ctx->channels + i;

		xm_envelopes(ch);
		xm_autovibrato(ctx, ch);

		if(ch->arp_in_progress && !HAS_ARPEGGIO(ch->current)) {
			ch->arp_in_progress = false;
			ch->arp_note_offset = 0;
			xm_update_frequency(ctx, ch);
		}
		if(ch->vibrato_in_progress && !HAS_VIBRATO(ch->current)) {
			ch->vibrato_in_progress = false;
			ch->vibrato_note_offset = 0.f;
			xm_update_frequency(ctx, ch);
		}

		switch(ch->current->volume_column >> 4) {

		case 0x6: /* Volume slide down */
			if(ctx->current_tick == 0) break;
			xm_volume_slide(ch, ch->current->volume_column & 0x0F);
			break;

		case 0x7: /* Volume slide up */
			if(ctx->current_tick == 0) break;
			xm_volume_slide(ch, ch->current->volume_column << 4);
			break;

		case 0xB: /* Vibrato */
			if(ctx->current_tick == 0) break;
			ch->vibrato_in_progress = false;
			xm_vibrato(ctx, ch, ch->vibrato_param);
			break;

		case 0xD: /* Panning slide left */
			if(ctx->current_tick == 0) break;
			xm_panning_slide(ch, ch->current->volume_column & 0x0F);
			break;

		case 0xE: /* Panning slide right */
			if(ctx->current_tick == 0) break;
			xm_panning_slide(ch, ch->current->volume_column << 4);
			break;

		case 0xF: /* Tone portamento */
			if(ctx->current_tick == 0) break;
			xm_tone_portamento(ctx, ch);
			break;

		default:
			break;

		}

		switch(ch->current->effect_type) {

		case 0: /* 0xy: Arpeggio */
			if(ch->current->effect_param > 0) {
				char arp_offset = ctx->tempo % 3;
				switch(arp_offset) {
				case 2: /* 0 -> x -> 0 -> y -> x -> … */
					if(ctx->current_tick == 1) {
						ch->arp_in_progress = true;
						ch->arp_note_offset = ch->current->effect_param >> 4;
						xm_update_frequency(ctx, ch);
						break;
					}
					/* No break here, this is intended */
				case 1: /* 0 -> 0 -> y -> x -> … */
					if(ctx->current_tick == 0) {
						ch->arp_in_progress = false;
						ch->arp_note_offset = 0;
						xm_update_frequency(ctx, ch);
						break;
					}
					/* No break here, this is intended */
				case 0: /* 0 -> y -> x -> … */
					xm_arpeggio(ctx, ch, ch->current->effect_param, ctx->current_tick - arp_offset);
				default:
					break;
				}
			}
			break;

		case 1: /* 1xx: Portamento up */
			if(ctx->current_tick == 0) break;
			xm_pitch_slide(ctx, ch, -ch->portamento_up_param);
			break;

		case 2: /* 2xx: Portamento down */
			if(ctx->current_tick == 0) break;
			xm_pitch_slide(ctx, ch, ch->portamento_down_param);
			break;

		case 3: /* 3xx: Tone portamento */
			if(ctx->current_tick == 0) break;
			xm_tone_portamento(ctx, ch);
			break;

		case 4: /* 4xy: Vibrato */
			if(ctx->current_tick == 0) break;
			ch->vibrato_in_progress = true;
			xm_vibrato(ctx, ch, ch->vibrato_param);
			break;

		case 5: /* 5xy: Tone portamento + Volume slide */
			if(ctx->current_tick == 0) break;
			xm_tone_portamento(ctx, ch);
			xm_volume_slide(ch, ch->volume_slide_param);
			break;

		case 6: /* 6xy: Vibrato + Volume slide */
			if(ctx->current_tick == 0) break;
			ch->vibrato_in_progress = true;
			xm_vibrato(ctx, ch, ch->vibrato_param);
			xm_volume_slide(ch, ch->volume_slide_param);
			break;

		case 7: /* 7xy: Tremolo */
			if(ctx->current_tick == 0) break;
			xm_tremolo(ctx, ch, ch->tremolo_param, ch->tremolo_ticks++);
			break;

		case 0xA: /* Axy: Volume slide */
			if(ctx->current_tick == 0) break;
			xm_volume_slide(ch, ch->volume_slide_param);
			break;

		case 0xE: /* EXy: Extended command */
			switch(ch->current->effect_param >> 4) {

			case 0x9: /* E9y: Retrigger note */
				if(ctx->current_tick != 0 && ch->current->effect_param & 0x0F) {
					if(!(ctx->current_tick % (ch->current->effect_param & 0x0F))) {
						xm_trigger_note(ctx, ch, XM_TRIGGER_KEEP_VOLUME);
						xm_envelopes(ch);
					}
				}
				break;

			case 0xC: /* ECy: Note cut */
				if((ch->current->effect_param & 0x0F) == ctx->current_tick) {
				    xm_cut_note(ch);
				}
				break;

			case 0xD: /* EDy: Note delay */
				if(ch->note_delay_param == ctx->current_tick) {
					xm_handle_note_and_instrument(ctx, ch, ch->current);
					xm_envelopes(ch);
				}
				break;

			default:
				break;

			}
			break;

		case 17: /* Hxy: Global volume slide */
			if(ctx->current_tick == 0) break;
			if((ch->global_volume_slide_param & 0xF0) &&
			   (ch->global_volume_slide_param & 0x0F)) {
				/* Illegal state */
				break;
			}
			if(ch->global_volume_slide_param & 0xF0) {
				/* Global slide up */
				float f = (float)(ch->global_volume_slide_param >> 4) / (float)0x40;
				ctx->global_volume += f;
				XM_CLAMP_UP(ctx->global_volume);
			} else {
				/* Global slide down */
				float f = (float)(ch->global_volume_slide_param & 0x0F) / (float)0x40;
				ctx->global_volume -= f;
				XM_CLAMP_DOWN(ctx->global_volume);
			}
			break;

		case 20: /* Kxx: Key off */
			/* Most documentations will tell you the parameter has no
			 * use. Don't be fooled. */
			if(ctx->current_tick == ch->current->effect_param) {
				xm_key_off(ch);
			}
			break;

		case 25: /* Pxy: Panning slide */
			if(ctx->current_tick == 0) break;
			xm_panning_slide(ch, ch->panning_slide_param);
			break;

		case 27: /* Rxy: Multi retrig note */
			if(ctx->current_tick == 0) break;
			if(((ch->multi_retrig_param) & 0x0F) == 0) break;
			if((ctx->current_tick % (ch->multi_retrig_param & 0x0F)) == 0) {
				xm_trigger_note(ctx, ch, XM_TRIGGER_KEEP_VOLUME | XM_TRIGGER_KEEP_ENVELOPE);

				/* Rxy doesn't affect volume if there's a command in the volume
				   column, or if the instrument has a volume envelope. */
				if (!ch->current->volume_column && !ch->instrument->volume_envelope.enabled){
					float v = ch->volume * multi_retrig_multiply[ch->multi_retrig_param >> 4]
						+ multi_retrig_add[ch->multi_retrig_param >> 4] / (float)0x40;
					XM_CLAMP(v);
					ch->volume = v;
				}
			}
			break;

		case 29: /* Txy: Tremor */
			if(ctx->current_tick == 0) break;
			ch->tremor_on = (
				(ctx->current_tick - 1) % ((ch->tremor_param >> 4) + (ch->tremor_param & 0x0F) + 2)
				>
				(ch->tremor_param >> 4)
			);
			break;

		default:
			break;

		}

		float panning, volume;

		panning = ch->panning +
			(ch->panning_envelope_panning - .5f) * (.5f - fabsf(ch->panning - .5f)) * 2.0f;

		if(ch->tremor_on) {
		        volume = .0f;
		} else {
			volume = ch->volume + ch->tremolo_volume;
			XM_CLAMP(volume);
			volume *= ch->fadeout_volume * ch->volume_envelope_volume;
		}

#if XM_RAMPING
		/* See https://modarchive.org/forums/index.php?topic=3517.0
		 * and https://github.com/Artefact2/libxm/pull/16 */
		ch->target_volume[0] = volume * sqrtf(1.f - panning);
		ch->target_volume[1] = volume * sqrtf(panning);
#else
		ch->actual_volume[0] = volume * sqrtf(1.f - panning);
		ch->actual_volume[1] = volume * sqrtf(panning);
#endif
	}

	ctx->current_tick++;
	if(ctx->current_tick >= ctx->tempo + ctx->extra_ticks) {
		ctx->current_tick = 0;
		ctx->extra_ticks = 0;
	}

	/* FT2 manual says number of ticks / second = BPM * 0.4 */
	ctx->remaining_samples_in_tick += (float)ctx->rate / ((float)ctx->bpm * 0.4f);
}